

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

void __thiscall cmGeneratedFileStream::~cmGeneratedFileStream(cmGeneratedFileStream *this)

{
  ~cmGeneratedFileStream
            ((cmGeneratedFileStream *)
             ((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream +
             (long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream[-3]));
  return;
}

Assistant:

cmGeneratedFileStream::~cmGeneratedFileStream()
{
  // This is the first destructor called.  Check the status of the
  // stream and give the information to the private base.  Next the
  // stream will be destroyed which will close the temporary file.
  // Finally the base destructor will be called to replace the
  // destination file.
  this->Okay = !this->fail();
}